

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O2

void __thiscall
cfdcapi_common_CfdSerializeByteData_Test::cfdcapi_common_CfdSerializeByteData_Test
          (cfdcapi_common_CfdSerializeByteData_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0064f530;
  return;
}

Assistant:

TEST(cfdcapi_common, CfdSerializeByteData) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;

  ret = CfdSerializeByteData(handle, "0123456789ab", &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("060123456789ab", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdSerializeByteData(handle, "", &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("00", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  const char* target = "111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd";
  const char* exp = "fd0401111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd111111111111111111112222222222222222222233333333333333333333444444444444444444445555555555555555555566666666666666666666777777777777777777778888888888888888888899999999999999999999aaaaaaaaaaaaaaaaaaaabbbbbbbbbbbbbbbbbbbbccccccccccccccccccccdddddddddddddddddddd";
  ret = CfdSerializeByteData(handle, target, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp, output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdSerializeByteData(handle, "", nullptr);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  ret = CfdSerializeByteData(handle, nullptr, &output);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}